

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O1

string_view __thiscall ritobin::io::impl_text_read::TextReader::read_word(TextReader *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  string_view sVar4;
  
  pbVar3 = (byte *)this->cur_;
  while (((pbVar3 != (byte *)this->cap_ && ((ulong)*pbVar3 < 0x21)) &&
         ((0x100002200U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
    this->cur_ = (char *)pbVar3;
  }
  pbVar2 = (byte *)this->cur_;
  while ((pbVar2 != (byte *)this->cap_ &&
         (((bVar1 = *pbVar2, bVar1 == 0x2b || (bVar1 == 0x5f)) ||
          (((byte)(bVar1 - 0x30) < 10 ||
           (((byte)(bVar1 - 0x2d) < 2 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))))))))) {
    pbVar2 = pbVar2 + 1;
    this->cur_ = (char *)pbVar2;
  }
  sVar4._M_len = (long)pbVar2 - (long)pbVar3;
  sVar4._M_str = (char *)pbVar3;
  return sVar4;
}

Assistant:

constexpr std::string_view read_word() noexcept {
            while (!is_eof() && one_of<' ', '\t', '\r'>(*cur_)) {
                cur_++;
            }
            auto const beg = cur_;
            while (!is_eof() && (one_of<'_', '+', '-', '.'>(*cur_)
                || in_range<'A', 'Z'>(*cur_)
                || in_range<'a', 'z'>(*cur_)
                || in_range<'0', '9'>(*cur_))) {
                cur_++;
            }
            return { beg, static_cast<size_t>(cur_ - beg) };
        }